

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSLoader.cpp
# Opt level: O2

ai_real __thiscall Assimp::Discreet3DSImporter::ParsePercentageChunk(Discreet3DSImporter *this)

{
  ushort uVar1;
  undefined8 in_RAX;
  float fVar2;
  Chunk chunk;
  Chunk local_16;
  
  local_16.Flag = (uint16_t)((ulong)in_RAX >> 0x10);
  ReadChunk(this,&local_16);
  if (local_16.Flag == 0x30) {
    uVar1 = StreamReader<false,_false>::Get<short>(this->stream);
    fVar2 = (float)uVar1;
  }
  else {
    if (local_16.Flag != 0x31) {
      return NAN;
    }
    fVar2 = StreamReader<false,_false>::Get<float>(this->stream);
    fVar2 = fVar2 * 100.0;
  }
  return fVar2 / 65535.0;
}

Assistant:

ai_real Discreet3DSImporter::ParsePercentageChunk() {
    Discreet3DS::Chunk chunk;
    ReadChunk(&chunk);

    if (Discreet3DS::CHUNK_PERCENTF == chunk.Flag) {
        return stream->GetF4() * ai_real(100) / ai_real(0xFFFF);
    } else if (Discreet3DS::CHUNK_PERCENTW == chunk.Flag) {
        return (ai_real)((uint16_t)stream->GetI2()) / (ai_real)0xFFFF;
    }

    return get_qnan();
}